

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGClient.cpp
# Opt level: O3

void __thiscall ViconCGStreamClientSDK::VCGClient::VCGClient(VCGClient *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_ICGClient)._vptr_ICGClient = (_func_int **)&PTR_Destroy_001a0d08;
  p_Var1 = &(this->m_Connected)._M_t._M_impl.super__Rb_tree_header;
  (this->m_Connected)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_Connected)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_pClients).
  super__Vector_base<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pClients).
  super__Vector_base<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_pClients).
  super__Vector_base<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_pCallbacks).
  super__Vector_base<std::shared_ptr<ViconCGStreamClientSDK::VCGClientCallback>,_std::allocator<std::shared_ptr<ViconCGStreamClientSDK::VCGClientCallback>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pCallbacks).
  super__Vector_base<std::shared_ptr<ViconCGStreamClientSDK::VCGClientCallback>,_std::allocator<std::shared_ptr<ViconCGStreamClientSDK::VCGClientCallback>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_pCallbacks).
  super__Vector_base<std::shared_ptr<ViconCGStreamClientSDK::VCGClientCallback>,_std::allocator<std::shared_ptr<ViconCGStreamClientSDK::VCGClientCallback>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_LastFrameIDs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_LastFrameIDs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_LastFrameIDs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_Connected)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_Connected)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_Connected)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_bMulticastReceiving = false;
  this->m_bMulticastController = false;
  p_Var1 = &(this->m_HapticDeviceOnList)._M_t._M_impl.super__Rb_tree_header;
  (this->m_HapticDeviceOnList)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_HapticDeviceOnList)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_HapticDeviceOnList)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_HapticDeviceOnList)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_HapticDeviceOnList)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  boost::recursive_mutex::recursive_mutex(&this->m_ClientMutex);
  (this->m_RequestedObjects).super_VItem._vptr_VItem = (_func_int **)&PTR_TypeID_001a0e48;
  p_Var1 = &(this->m_RequestedObjects).m_Enums._M_t._M_impl.super__Rb_tree_header;
  (this->m_RequestedObjects).m_Enums._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_RequestedObjects).m_Enums._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_RequestedObjects).m_Enums._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_RequestedObjects).m_Enums._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_RequestedObjects).m_Enums._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_pLastStaticObjects).super___shared_ptr<const_VStaticObjects,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_pLastStaticObjects).super___shared_ptr<const_VStaticObjects,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_FrameDeque).
  super__Deque_base<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_FrameDeque).
  super__Deque_base<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->m_FrameDeque).
  super__Deque_base<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_FrameDeque).
  super__Deque_base<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_FrameDeque).
  super__Deque_base<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_FrameDeque).
  super__Deque_base<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_FrameDeque).
  super__Deque_base<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_FrameDeque).
  super__Deque_base<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_FrameDeque).
  super__Deque_base<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_FrameDeque).
  super__Deque_base<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
  ::_M_initialize_map(&(this->m_FrameDeque).
                       super__Deque_base<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>,_std::allocator<std::pair<std::shared_ptr<const_VStaticObjects>,_std::shared_ptr<const_VDynamicObjects>_>_>_>
                      ,0);
  this->m_MaxBufferSize = 1;
  boost::condition_variable_any::condition_variable_any(&this->m_NewFramesCondition);
  return;
}

Assistant:

VCGClient::VCGClient()
: m_bMulticastReceiving( false )
, m_bMulticastController( false )
, m_MaxBufferSize( 1 )
{
}